

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O0

void do_cmd_knowledge_runes(char *name,wchar_t row)

{
  group_funcs g_funcs;
  member_funcs o_funcs;
  _Bool _Var1;
  wchar_t wVar2;
  int *obj_list;
  char local_b8 [8];
  char buf [30];
  wchar_t local_8c;
  wchar_t local_88;
  wchar_t i;
  wchar_t count;
  wchar_t rune_max;
  int *runes;
  member_funcs rune_f;
  group_funcs rune_var_f;
  wchar_t row_local;
  char *name_local;
  
  memcpy(&rune_f.is_visual,&PTR_rune_var_name_00362868,0x28);
  memcpy(&runes,&PTR_display_rune_00362890,0x38);
  wVar2 = max_runes();
  local_88 = L'\0';
  obj_list = (int *)mem_zalloc((long)wVar2 << 2);
  for (local_8c = L'\0'; local_8c < wVar2; local_8c = local_8c + L'\x01') {
    _Var1 = player_knows_rune(player,(long)local_8c);
    if (_Var1) {
      obj_list[local_88] = local_8c;
      local_88 = local_88 + L'\x01';
    }
  }
  strnfmt(local_b8,0x1e,"runes (%d unknown)",(ulong)(uint)(wVar2 - local_88));
  g_funcs.gcomp = (_func_wchar_t_void_ptr_void_ptr *)rune_var_f.name;
  g_funcs.name = (_func_char_ptr_wchar_t *)rune_f._48_8_;
  g_funcs.group = (_func_wchar_t_wchar_t *)rune_var_f.gcomp;
  g_funcs.summary =
       (_func_void_wchar_t_wchar_t_ptr_wchar_t_wchar_t_wchar_t_wchar_t *)rune_var_f.group;
  g_funcs._32_8_ = rune_var_f.summary;
  o_funcs.lore = (_func_void_wchar_t *)rune_f.display_member;
  o_funcs.display_member = (_func_void_wchar_t_wchar_t__Bool_wchar_t *)runes;
  o_funcs.xchar = (_func_wchar_t_ptr_wchar_t *)rune_f.lore;
  o_funcs.xattr = (_func_uint8_t_ptr_wchar_t *)rune_f.xchar;
  o_funcs.xtra_prompt = (_func_char_ptr_wchar_t *)rune_f.xattr;
  o_funcs.xtra_act = (_func_void_keypress_wchar_t *)rune_f.xtra_prompt;
  o_funcs._48_8_ = rune_f.xtra_act;
  display_knowledge(local_b8,obj_list,local_88,g_funcs,o_funcs,"Inscribed");
  mem_free(obj_list);
  return;
}

Assistant:

static void do_cmd_knowledge_runes(const char *name, int row)
{
	group_funcs rune_var_f = {rune_var_name, NULL, rune_var, 0,
							  N_ELEMENTS(rune_group_text), false};

	member_funcs rune_f = {display_rune, rune_lore, NULL, NULL,
						   rune_xtra_prompt, rune_xtra_act, 0};

	int *runes;
	int rune_max = max_runes();
	int count = 0;
	int i;
	char buf[30];

	runes = mem_zalloc(rune_max * sizeof(int));

	for (i = 0; i < rune_max; i++) {
		/* Ignore unknown runes */
		if (!player_knows_rune(player, i))
			continue;

		runes[count++] = i;
	}

	strnfmt(buf, sizeof(buf), "runes (%d unknown)", rune_max - count);

	display_knowledge(buf, runes, count, rune_var_f, rune_f, "Inscribed");
	mem_free(runes);
}